

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# broadcast.cpp
# Opt level: O2

void onDataServer(Ptr *ss,Ptr *buff,size_t n)

{
  TCPSocket *this;
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  bool bVar3;
  any *paVar4;
  pointer p_Var5;
  pair<std::shared_ptr<hwnet::Buffer>,_int> *this_00;
  _Impl *this_01;
  undefined1 local_e8 [8];
  shared_ptr<hwnet::Buffer> msg;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d0 [2];
  Ptr local_c0;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<hwnet::ClosureTask,_std::allocator<hwnet::ClosureTask>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_b0;
  undefined1 local_a0 [8];
  pair<std::shared_ptr<hwnet::Buffer>,_int> ret;
  undefined1 auStack_80 [16];
  undefined8 uStack_70;
  __shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2> local_68;
  Codecc *local_58;
  _Impl *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_48;
  Ptr *local_40;
  allocator_type local_31 [8];
  __allocator_type __a2;
  
  local_40 = ss;
  paVar4 = hwnet::TCPSocket::GetUserData
                     ((ss->super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
  ;
  local_58 = (Codecc *)paVar4->content[1]._vptr_placeholder;
  local_58->w = local_58->w + n;
  while( true ) {
    bVar3 = hwnet::TCPSocket::IsClosed
                      ((local_40->super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr);
    if (bVar3) {
      return;
    }
    Codecc::Decode((pair<std::shared_ptr<hwnet::Buffer>,_int> *)local_a0,local_58);
    if ((int)ret.first.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi != 0) break;
    if (local_a0 == (undefined1  [8])0x0) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&ret);
      this = (local_40->super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      Codecc::GetRecvBuffer((Codecc *)&ret.second);
      hwnet::TCPSocket::Recv(this,(Ptr *)&ret.second);
      this_00 = (pair<std::shared_ptr<hwnet::Buffer>,_int> *)auStack_80;
      goto LAB_00118a75;
    }
    std::__shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2> *)local_e8,
               (__shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2> *)local_a0);
    std::__shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_68,(__shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2> *)local_e8);
    _Var2._M_pi = local_68._M_refcount._M_pi;
    peVar1 = local_68._M_ptr;
    msg.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_ptr;
    local_d0[0]._M_pi = local_68._M_refcount._M_pi;
    local_68._M_ptr = (element_type *)0x0;
    local_68._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_50 = (_Impl *)0x0;
    p_Var5 = std::
             allocator_traits<std::allocator<std::_Sp_counted_ptr_inplace<hwnet::ClosureTask,_std::allocator<hwnet::ClosureTask>,_(__gnu_cxx::_Lock_policy)2>_>_>
             ::allocate(local_31,1);
    (p_Var5->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
    (p_Var5->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
    (p_Var5->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
         (_func_int **)&PTR___Sp_counted_ptr_inplace_0012e4e8;
    auStack_80._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    uStack_70._0_4_ = 0;
    uStack_70._4_4_ = 0;
    ret.second = 0;
    ret._20_4_ = 0;
    auStack_80._0_8_ = (element_type *)0x0;
    local_b0._M_alloc = local_31;
    local_b0._M_ptr = p_Var5;
    ret._16_8_ = operator_new(0x18);
    this_01 = &p_Var5->_M_impl;
    local_d0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(element_type **)ret._16_8_ = peVar1;
    msg.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(ret._16_8_ + 8) = _Var2._M_pi;
    uStack_70 = std::
                _Function_handler<void_(),_std::_Bind<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sniperHW[P]hwnet/test/broadcast.cpp:103:28)_()>_>
                ::_M_invoke;
    auStack_80._8_8_ =
         std::
         _Function_handler<void_(),_std::_Bind<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sniperHW[P]hwnet/test/broadcast.cpp:103:28)_()>_>
         ::_M_manager;
    hwnet::ClosureTask::ClosureTask((ClosureTask *)this_01,(Callback *)&ret.second);
    std::_Function_base::~_Function_base((_Function_base *)&ret.second);
    local_b0._M_ptr = (pointer)0x0;
    local_50 = this_01;
    _Stack_48._M_pi = &p_Var5->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>;
    std::
    __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<hwnet::ClosureTask,_std::allocator<hwnet::ClosureTask>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr(&local_b0);
    std::__shared_ptr<hwnet::ClosureTask,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<hwnet::ClosureTask,hwnet::ClosureTask>
              ((__shared_ptr<hwnet::ClosureTask,(__gnu_cxx::_Lock_policy)2> *)&local_50,
               (ClosureTask *)this_01);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_d0);
    local_c0.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_50;
    local_c0.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Stack_48._M_pi;
    local_50 = (_Impl *)0x0;
    _Stack_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    hwnet::ThreadPool::TaskQueue::PostTask(&mainThread.queue_,&local_c0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_c0.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&msg);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&ret);
  }
  hwnet::TCPSocket::Close
            ((local_40->super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  this_00 = &ret;
LAB_00118a75:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00);
  return;
}

Assistant:

void onDataServer(const TCPSocket::Ptr &ss,const Buffer::Ptr &buff,size_t n) {
	//bytes += n;
	//printf("onData server\n");
	Codecc *code = any_cast<Codecc*>(ss->GetUserData());
	code->onData(n);
	for( ; ; ) {
		if(ss->IsClosed()) return;
		std::pair<Buffer::Ptr,int> ret = code->Decode();
		if(ret.second == 0) {
			if(ret.first != nullptr) {
				auto msg = ret.first;
				mainThread.PostClosure([msg](){
					ccount++;
					std::vector<TCPSocket::Ptr>::iterator it = clients.begin();
					std::vector<TCPSocket::Ptr>::iterator end = clients.end();
					for( ; it != end; it++){
						(*it)->Send(msg);
						count++;
					}
				});
			} else {
				break;
			}
		} else {
			ss->Close();
			return;
		}
	}
	ss->Recv(code->GetRecvBuffer());
}